

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScanlineAdapterTests.cpp
# Opt level: O2

void __thiscall agge::tests::ScanlineAdapterTests::ScanlineAdapterTests(ScanlineAdapterTests *this)

{
  ut::
  test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__ScanlineAllocatesTheNecessaryAmountOfCoversOnConstruction_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__ScanlineAllocatesTheNecessaryAmountOfCoversOnConstruction_meta>
              *)this);
  ut::
  test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__CoversArrayIsOnlyBeEnlarged_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__CoversArrayIsOnlyBeEnlarged_meta>
              *)&this->field_0x1);
  ut::
  test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__CommitingEmptyScanlineLeadsToAnEmptyRenderCall_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__CommitingEmptyScanlineLeadsToAnEmptyRenderCall_meta>
              *)&this->field_0x2);
  ut::
  test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__ScanlineIsPositionedAtZeroOnCreation_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__ScanlineIsPositionedAtZeroOnCreation_meta>
              *)&this->field_0x3);
  ut::
  test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__AddingCellToCleanScanlineMakesNoCommit_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__AddingCellToCleanScanlineMakesNoCommit_meta>
              *)&this->field_0x4);
  ut::
  test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__AddingSpanToCleanScanlineMakesNoCommit_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__AddingSpanToCleanScanlineMakesNoCommit_meta>
              *)&this->field_0x5);
  ut::
  test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__AddingAdjacentCellsAndSpansMakesNoCommit_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__AddingAdjacentCellsAndSpansMakesNoCommit_meta>
              *)&this->field_0x6);
  ut::
  test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__AddingNonAdjacentCellCommitsState_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__AddingNonAdjacentCellCommitsState_meta>
              *)&this->field_0x7);
  ut::
  test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__AddCommitCycleMakesRenditionCalls_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__AddCommitCycleMakesRenditionCalls_meta>
              *)&this->field_0x8);
  ut::
  test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__StaleCoverValuesAreAccessibleAndUnchanged_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__StaleCoverValuesAreAccessibleAndUnchanged_meta>
              *)&this->field_0x9);
  ut::
  test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__BeginScanlineDelegatesToSetY_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::ScanlineAdapterTests,_&agge::tests::ScanlineAdapterTests::__BeginScanlineDelegatesToSetY_meta>
              *)&this->field_0xa);
  return;
}

Assistant:

test( ScanlineAllocatesTheNecessaryAmountOfCoversOnConstruction )
			{
				// INIT
				mocks::renderer_adapter<> r1;
				raw_memory_object b1;

				mocks::renderer_adapter<uint16_t> r2;
				raw_memory_object b2;

				// INIT / ACT
				scanline_adapter< mocks::renderer_adapter<> > sl1(r1, b1, 11);
				scanline_adapter< mocks::renderer_adapter<uint16_t> > sl2(r2, b2, 17);

				// ASSERT
				assert_is_true(enough_capacity<uint8_t>(b1, 11 + 4));
				assert_is_true(enough_capacity<uint16_t>(b2, 17 + 4));

				// INIT / ACT
				scanline_adapter< mocks::renderer_adapter<> > sl3(r1, b1, 1311);

				// ASSERT
				assert_is_true(enough_capacity<uint8_t>(b1, 1311 + 4));
			}